

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void anon_unknown.dwarf_73c935::noise_synth
               (ACMRandom *random,int lag,int n,int (*coords) [2],double *coeffs,double *data,int w,
               int h)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ulong uVar5;
  double *__dest;
  pointer __src;
  bool bVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> padded;
  allocator_type local_99;
  long local_98;
  long local_90;
  long local_88;
  _Vector_base<double,_std::allocator<double>_> local_80;
  ulong local_68;
  undefined8 local_60;
  double *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ACMRandom *local_38;
  
  local_60 = CONCAT44(in_register_00000034,lag);
  uVar1 = lag * 3 + w;
  uVar3 = lag * 3 + h;
  local_58 = data;
  local_38 = random;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_80,(long)(int)(uVar3 * uVar1),
             &local_99);
  local_98 = 0;
  local_50 = 0;
  if (0 < (int)uVar1) {
    local_50 = (ulong)uVar1;
  }
  local_48 = 0;
  if (0 < (int)uVar3) {
    local_48 = (ulong)uVar3;
  }
  local_88 = (long)(int)uVar1;
  local_90 = local_88 * 8;
  local_68 = (ulong)uVar3;
  for (local_40 = 0; uVar5 = local_50, lVar2 = local_98, local_40 != local_48;
      local_40 = local_40 + 1) {
    while (uVar5 != 0) {
      dVar7 = randn(local_38,1.0);
      *(double *)((long)local_80._M_impl.super__Vector_impl_data._M_start + lVar2) = dVar7;
      uVar5 = uVar5 - 1;
      lVar2 = lVar2 + 8;
    }
    local_98 = local_98 + local_90;
  }
  if (n < 1) {
    n = 0;
  }
  for (lVar2 = (long)(int)local_60; lVar2 < (int)local_68; lVar2 = lVar2 + 1) {
    for (lVar4 = (long)(int)local_60; lVar4 < local_88; lVar4 = lVar4 + 1) {
      dVar7 = 0.0;
      for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
        dVar7 = dVar7 + local_80._M_impl.super__Vector_impl_data._M_start
                        [(int)(coords[uVar5][0] + (int)lVar4 +
                              (coords[uVar5][1] + (int)lVar2) * uVar1)] * coeffs[uVar5];
      }
      local_80._M_impl.super__Vector_impl_data._M_start[lVar2 * local_88 + lVar4] =
           dVar7 + local_80._M_impl.super__Vector_impl_data._M_start[lVar2 * local_88 + lVar4];
    }
  }
  uVar5 = 0;
  __dest = local_58;
  __src = local_80._M_impl.super__Vector_impl_data._M_start;
  if (0 < h) {
    uVar5 = (ulong)(uint)h;
  }
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    memcpy(__dest,__src,(ulong)(uint)w << 3);
    __dest = __dest + w;
    __src = (pointer)((long)__src + local_90);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
  return;
}

Assistant:

void noise_synth(libaom_test::ACMRandom *random, int lag, int n,
                 const int (*coords)[2], const double *coeffs, double *data,
                 int w, int h) {
  const int pad_size = 3 * lag;
  const int padded_w = w + pad_size;
  const int padded_h = h + pad_size;
  int x = 0, y = 0;
  std::vector<double> padded(padded_w * padded_h);

  for (y = 0; y < padded_h; ++y) {
    for (x = 0; x < padded_w; ++x) {
      padded[y * padded_w + x] = randn(random, 1.0);
    }
  }
  for (y = lag; y < padded_h; ++y) {
    for (x = lag; x < padded_w; ++x) {
      double sum = 0;
      int i = 0;
      for (i = 0; i < n; ++i) {
        const int dx = coords[i][0];
        const int dy = coords[i][1];
        sum += padded[(y + dy) * padded_w + (x + dx)] * coeffs[i];
      }
      padded[y * padded_w + x] += sum;
    }
  }
  // Copy over the padded rows to the output
  for (y = 0; y < h; ++y) {
    memcpy(data + y * w, &padded[0] + y * padded_w, sizeof(*data) * w);
  }
}